

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O1

char * ssh_share_sockname(char *host,int port,Conf *conf)

{
  int iVar1;
  char *ptr;
  char *pcVar2;
  
  iVar1 = conf_get_int(conf,2);
  if (iVar1 == 4) {
    ptr = (char *)0x0;
  }
  else {
    ptr = get_remote_username(conf);
  }
  if (port == 0x16) {
    if (ptr == (char *)0x0) {
      pcVar2 = dupprintf("%s",host);
    }
    else {
      pcVar2 = dupprintf("%s@%s",ptr,host);
    }
  }
  else if (ptr == (char *)0x0) {
    pcVar2 = dupprintf("%s:%d",host,port);
  }
  else {
    pcVar2 = dupprintf("%s@%s:%d",ptr,host,port);
  }
  safefree(ptr);
  return pcVar2;
}

Assistant:

char *ssh_share_sockname(const char *host, int port, Conf *conf)
{
    char *username = NULL;
    char *sockname;

    /* Include the username we're logging in as in the hash, unless
     * we're using a protocol for which it's completely irrelevant. */
    if (conf_get_int(conf, CONF_protocol) != PROT_SSHCONN)
        username = get_remote_username(conf);

    if (port == 22) {
        if (username)
            sockname = dupprintf("%s@%s", username, host);
        else
            sockname = dupprintf("%s", host);
    } else {
        if (username)
            sockname = dupprintf("%s@%s:%d", username, host, port);
        else
            sockname = dupprintf("%s:%d", host, port);
    }

    sfree(username);
    return sockname;
}